

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.h
# Opt level: O0

void __thiscall
ObjTypeSpecFldInfo::ObjTypeSpecFldInfo
          (ObjTypeSpecFldInfo *this,uint id,TypeId typeId,JITType *initialType,bool usesAuxSlot,
          bool isLoadedFromProto,bool usesAccessor,bool isFieldValueFixed,bool keepFieldValue,
          bool isBuiltIn,uint16 slotIndex,PropertyId propertyId,DynamicObject *protoObject,
          PropertyGuard *propertyGuard,JITTimeConstructorCache *ctorCache,
          FixedFieldInfo *fixedFieldInfoArray)

{
  TypeIDL *ptr;
  intptr_t *ptr_00;
  JITTimeConstructorCacheIDL *ptr_01;
  FixedFieldIDL *ptr_02;
  byte local_41;
  nullptr_t local_40;
  nullptr_t local_38;
  ushort local_30;
  byte local_2e;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  ObjTypeSpecFldInfoFlags flags;
  bool isBuiltIn_local;
  bool keepFieldValue_local;
  bool isFieldValueFixed_local;
  bool usesAccessor_local;
  bool isLoadedFromProto_local;
  bool usesAuxSlot_local;
  JITType *initialType_local;
  TypeId typeId_local;
  uint id_local;
  ObjTypeSpecFldInfo *this_local;
  
  local_2b = usesAccessor;
  local_2c = isFieldValueFixed;
  local_2d = keepFieldValue;
  local_2e = isBuiltIn;
  local_2a = isLoadedFromProto;
  local_29 = usesAuxSlot;
  _flags = initialType;
  initialType_local._0_4_ = typeId;
  initialType_local._4_4_ = id;
  _typeId_local = this;
  ObjTypeSpecFldIDL::ObjTypeSpecFldIDL(&this->m_data);
  ObjTypeSpecFldInfoFlags::ObjTypeSpecFldInfoFlags((ObjTypeSpecFldInfoFlags *)&local_30,1);
  local_41 = 0;
  if ((local_2a & 1) == 0) {
    local_41 = local_2b ^ 0xff;
  }
  local_30 = local_30 & 0xc40d | (ushort)(local_29 & 1) << 4 | (ushort)(local_41 & 1) << 5 |
             (ushort)(local_2a & 1) << 6 | (ushort)(local_2b & 1) << 7 | (local_2c & 1) << 8 |
             (ushort)(local_2d & 1) << 9 | (ushort)(_flags != (JITType *)0x0) << 0xb | 0x1000 |
             (ushort)(local_2e & 1) << 0xd;
  (this->m_data).flags = local_30;
  (this->m_data).id = initialType_local._4_4_;
  (this->m_data).typeId = (TypeId)initialType_local;
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<EquivalentTypeSetIDL>::operator=(&(this->m_data).typeSet,&local_38);
  ptr = JITType::GetData(_flags);
  Memory::WriteBarrierPtr<TypeIDL>::operator=(&(this->m_data).initialType,ptr);
  (this->m_data).slotIndex = slotIndex;
  (this->m_data).polymorphicInfoCount = 0;
  (this->m_data).propertyId = propertyId;
  Memory::WriteBarrierPtr<void>::operator=(&(this->m_data).protoObjectAddr,protoObject);
  ptr_00 = Js::PropertyGuard::GetAddressOfValue(propertyGuard);
  Memory::WriteBarrierPtr<void>::operator=(&(this->m_data).propertyGuardValueAddr,ptr_00);
  ptr_01 = JITTimeConstructorCache::GetData(ctorCache);
  Memory::WriteBarrierPtr<JITTimeConstructorCacheIDL>::operator=(&(this->m_data).ctorCache,ptr_01);
  (this->m_data).fixedFieldCount = 1;
  (this->m_data).fixedFieldInfoArraySize = 1;
  ptr_02 = FixedFieldInfo::GetRaw(fixedFieldInfoArray);
  Memory::WriteBarrierPtr<FixedFieldIDL>::operator=(&(this->m_data).fixedFieldInfoArray,ptr_02);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<ObjTypeSpecPolymorphicInfoIDL>::operator=
            (&(this->m_data).polymorphicInfoArray,&local_40);
  return;
}

Assistant:

ObjTypeSpecFldInfo(uint id, Js::TypeId typeId, JITType* initialType,
        bool usesAuxSlot, bool isLoadedFromProto, bool usesAccessor, bool isFieldValueFixed, bool keepFieldValue, bool isBuiltIn,
        uint16 slotIndex, Js::PropertyId propertyId, Js::DynamicObject* protoObject, Js::PropertyGuard* propertyGuard,
        JITTimeConstructorCache* ctorCache, FixedFieldInfo* fixedFieldInfoArray)
    {
        ObjTypeSpecFldInfoFlags flags(InitialObjTypeSpecFldInfoFlagValue);
        flags.isPolymorphic = false;
        flags.usesAuxSlot = usesAuxSlot;
        flags.isLocal = !isLoadedFromProto && !usesAccessor;
        flags.isLoadedFromProto = isLoadedFromProto;
        flags.usesAccessor = usesAccessor;
        flags.hasFixedValue = isFieldValueFixed;
        flags.keepFieldValue = keepFieldValue;
        flags.isBeingAdded = initialType != nullptr;
        flags.doesntHaveEquivalence = true; // doesn't mean anything for data from a monomorphic cache
        flags.isBuiltIn = isBuiltIn;
        m_data.flags = flags.flags;

        m_data.id = id;
        m_data.typeId = typeId;
        m_data.typeSet = nullptr;
        m_data.initialType = initialType->GetData();
        m_data.slotIndex = slotIndex;
        m_data.polymorphicInfoCount = 0;
        m_data.propertyId = propertyId;
        m_data.protoObjectAddr = protoObject;
        m_data.propertyGuardValueAddr = (void*)propertyGuard->GetAddressOfValue();
        m_data.ctorCache = ctorCache->GetData();
        m_data.fixedFieldCount = 1;
        m_data.fixedFieldInfoArraySize = 1;
        m_data.fixedFieldInfoArray = fixedFieldInfoArray->GetRaw();
        m_data.polymorphicInfoArray = nullptr;
    }